

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O2

bool anon_unknown.dwarf_4954b::DecodeBase64
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out,string *in)

{
  uint8_t *out_00;
  int iVar1;
  size_t len;
  size_type local_20;
  
  iVar1 = EVP_DecodedLength(&local_20,in->_M_string_length);
  if (iVar1 != 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(out,local_20);
    out_00 = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = EVP_DecodeBase64(out_00,&local_20,
                             (long)(out->
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)out_00,
                             (uint8_t *)(in->_M_dataplus)._M_p,in->_M_string_length);
    if (iVar1 != 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(out,local_20);
      return true;
    }
  }
  fprintf(_stderr,"Invalid base64: %s.\n",(in->_M_dataplus)._M_p);
  return false;
}

Assistant:

bool DecodeBase64(std::vector<uint8_t> *out, const std::string &in) {
  size_t len;
  if (!EVP_DecodedLength(&len, in.size())) {
    fprintf(stderr, "Invalid base64: %s.\n", in.c_str());
    return false;
  }
  out->resize(len);
  if (!EVP_DecodeBase64(out->data(), &len, out->size(),
                        reinterpret_cast<const uint8_t *>(in.data()),
                        in.size())) {
    fprintf(stderr, "Invalid base64: %s.\n", in.c_str());
    return false;
  }
  out->resize(len);
  return true;
}